

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PushPolicyBarrier(cmMakefile *this)

{
  iterator __position;
  unsigned_long local_8;
  
  local_8 = ((long)(this->PolicyStack).
                   super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->PolicyStack).
                   super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  __position._M_current =
       (this->PolicyBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->PolicyBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->PolicyBarriers,__position,&local_8);
  }
  else {
    *__position._M_current = local_8;
    (this->PolicyBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void cmMakefile::PushPolicyBarrier()
{
  this->PolicyBarriers.push_back(this->PolicyStack.size());
}